

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

iterator __thiscall
llvm::SmallVectorImpl<unsigned_char>::insert<char_const*,void>
          (SmallVectorImpl<unsigned_char> *this,iterator I,char *From,char *To)

{
  void *pvVar1;
  char *pcVar2;
  size_t sVar3;
  uchar *E;
  char *local_110;
  uchar *J;
  size_t NumOverwritten;
  uchar *OldEnd;
  move_iterator<unsigned_char_*> local_f0;
  uchar *local_e8;
  uchar *OldEnd_1;
  size_t NumToInsert;
  size_t InsertElt;
  char *To_local;
  char *From_local;
  iterator I_local;
  SmallVectorImpl<unsigned_char> *this_local;
  SmallVectorImpl<unsigned_char> *local_a8;
  SmallVectorImpl<unsigned_char> *local_a0;
  SmallVectorImpl<unsigned_char> *local_98;
  SmallVectorImpl<unsigned_char> *local_90;
  SmallVectorImpl<unsigned_char> *local_88;
  SmallVectorImpl<unsigned_char> *local_80;
  SmallVectorImpl<unsigned_char> *local_78;
  SmallVectorImpl<unsigned_char> *local_70;
  SmallVectorImpl<unsigned_char> *local_68;
  SmallVectorImpl<unsigned_char> *local_60;
  SmallVectorImpl<unsigned_char> *local_58;
  SmallVectorImpl<unsigned_char> *local_50;
  SmallVectorImpl<unsigned_char> *local_48;
  SmallVectorImpl<unsigned_char> *local_40;
  SmallVectorImpl<unsigned_char> *local_38;
  SmallVectorImpl<unsigned_char> *local_30;
  SmallVectorImpl<unsigned_char> *local_28;
  SmallVectorImpl<unsigned_char> *local_20;
  SmallVectorImpl<unsigned_char> *local_10;
  
  NumToInsert = (long)I - (long)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                                super_SmallVectorTemplateCommon<unsigned_char,_void>.
                                super_SmallVectorBase.BeginX;
  pvVar1 = (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
           super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX;
  InsertElt = (size_t)To;
  To_local = From;
  From_local = (char *)I;
  I_local = (iterator)this;
  local_70 = this;
  local_68 = this;
  local_10 = this;
  sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
  pcVar2 = From_local;
  if (I == (iterator)((long)pvVar1 + sVar3)) {
    append<char_const*,void>(this,To_local,(char *)InsertElt);
    this_local = (SmallVectorImpl<unsigned_char> *)
                 ((long)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                        super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.
                        BeginX + NumToInsert);
  }
  else {
    local_20 = this;
    if (From_local <
        (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
        super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX) {
      __assert_fail("I >= this->begin() && \"Insertion iterator is out of bounds.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x259,
                    "iterator llvm::SmallVectorImpl<unsigned char>::insert(iterator, ItTy, ItTy) [T = unsigned char, ItTy = const char *]"
                   );
    }
    pvVar1 = (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
             super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX;
    local_78 = this;
    local_60 = this;
    sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
    if ((char *)((long)pvVar1 + sVar3) < pcVar2) {
      __assert_fail("I <= this->end() && \"Inserting past the end of the vector.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x25a,
                    "iterator llvm::SmallVectorImpl<unsigned char>::insert(iterator, ItTy, ItTy) [T = unsigned char, ItTy = const char *]"
                   );
    }
    OldEnd_1 = (uchar *)std::distance<char_const*>(To_local,(char *)InsertElt);
    sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
    reserve(this,(size_type)(OldEnd_1 + sVar3));
    From_local = (char *)((long)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                                super_SmallVectorTemplateCommon<unsigned_char,_void>.
                                super_SmallVectorBase.BeginX + NumToInsert);
    pvVar1 = (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
             super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX;
    local_80 = this;
    local_58 = this;
    local_28 = this;
    sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
    if ((uchar *)((long)pvVar1 + (sVar3 - (long)From_local)) < OldEnd_1) {
      pvVar1 = (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
               super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX;
      local_a0 = this;
      local_38 = this;
      sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
      E = (uchar *)((long)pvVar1 + sVar3);
      sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
      SmallVectorBase::set_size((SmallVectorBase *)this,(size_t)(OldEnd_1 + sVar3));
      pcVar2 = From_local;
      J = E + -(long)From_local;
      pvVar1 = (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
               super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX;
      local_a8 = this;
      local_30 = this;
      sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
      SmallVectorTemplateBase<unsigned_char,true>::uninitialized_move<unsigned_char*,unsigned_char*>
                ((uchar *)pcVar2,E,(uchar *)((long)pvVar1 + (sVar3 - (long)J)));
      local_110 = From_local;
      for (; J != (uchar *)0x0; J = J + -1) {
        *local_110 = *To_local;
        local_110 = local_110 + 1;
        To_local = To_local + 1;
      }
      SmallVectorTemplateBase<unsigned_char,true>::uninitialized_copy<char_const*,unsigned_char*>
                (To_local,(char *)InsertElt,E);
      this_local = (SmallVectorImpl<unsigned_char> *)From_local;
    }
    else {
      pvVar1 = (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
               super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX;
      local_88 = this;
      local_50 = this;
      sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
      local_e8 = (uchar *)((long)pvVar1 + sVar3);
      pvVar1 = (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
               super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX;
      local_90 = this;
      local_48 = this;
      sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
      std::move_iterator<unsigned_char_*>::move_iterator
                (&local_f0,(iterator_type)((long)pvVar1 + (sVar3 - (long)OldEnd_1)));
      pvVar1 = (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
               super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX;
      local_98 = this;
      local_40 = this;
      sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
      std::move_iterator<unsigned_char_*>::move_iterator
                ((move_iterator<unsigned_char_*> *)&OldEnd,(iterator_type)((long)pvVar1 + sVar3));
      append<std::move_iterator<unsigned_char*>,void>
                (this,local_f0,(move_iterator<unsigned_char_*>)OldEnd);
      std::move_backward<unsigned_char*,unsigned_char*>
                ((uchar *)From_local,local_e8 + -(long)OldEnd_1,local_e8);
      std::copy<char_const*,unsigned_char*>(To_local,(char *)InsertElt,(uchar *)From_local);
      this_local = (SmallVectorImpl<unsigned_char> *)From_local;
    }
  }
  return (iterator)this_local;
}

Assistant:

iterator insert(iterator I, ItTy From, ItTy To) {
    // Convert iterator to elt# to avoid invalidating iterator when we reserve()
    size_t InsertElt = I - this->begin();

    if (I == this->end()) {  // Important special case for empty vector.
      append(From, To);
      return this->begin()+InsertElt;
    }

    assert(I >= this->begin() && "Insertion iterator is out of bounds.");
    assert(I <= this->end() && "Inserting past the end of the vector.");

    size_t NumToInsert = std::distance(From, To);

    // Ensure there is enough space.
    reserve(this->size() + NumToInsert);

    // Uninvalidate the iterator.
    I = this->begin()+InsertElt;

    // If there are more elements between the insertion point and the end of the
    // range than there are being inserted, we can use a simple approach to
    // insertion.  Since we already reserved space, we know that this won't
    // reallocate the vector.
    if (size_t(this->end()-I) >= NumToInsert) {
      T *OldEnd = this->end();
      append(std::move_iterator<iterator>(this->end() - NumToInsert),
             std::move_iterator<iterator>(this->end()));

      // Copy the existing elements that get replaced.
      std::move_backward(I, OldEnd-NumToInsert, OldEnd);

      std::copy(From, To, I);
      return I;
    }

    // Otherwise, we're inserting more elements than exist already, and we're
    // not inserting at the end.

    // Move over the elements that we're about to overwrite.
    T *OldEnd = this->end();
    this->set_size(this->size() + NumToInsert);
    size_t NumOverwritten = OldEnd-I;
    this->uninitialized_move(I, OldEnd, this->end()-NumOverwritten);

    // Replace the overwritten part.
    for (T *J = I; NumOverwritten > 0; --NumOverwritten) {
      *J = *From;
      ++J; ++From;
    }

    // Insert the non-overwritten middle part.
    this->uninitialized_copy(From, To, OldEnd);
    return I;
  }